

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockaddr.c
# Opt level: O3

size_t nni_posix_nn2sockaddr(void *sa,nni_sockaddr *na)

{
  undefined8 uVar1;
  size_t sVar2;
  
  if (na == (nni_sockaddr *)0x0 || sa == (void *)0x0) {
    return 0;
  }
  switch(na->s_family) {
  case 2:
    *(undefined8 *)((long)sa + 0x5e) = 0;
    *(undefined8 *)((long)sa + 0x66) = 0;
    *(undefined8 *)((long)sa + 0x50) = 0;
    *(undefined8 *)((long)sa + 0x58) = 0;
    *(undefined8 *)((long)sa + 0x40) = 0;
    *(undefined8 *)((long)sa + 0x48) = 0;
    *(undefined8 *)((long)sa + 0x30) = 0;
    *(undefined8 *)((long)sa + 0x38) = 0;
    *(undefined8 *)((long)sa + 0x20) = 0;
    *(undefined8 *)((long)sa + 0x28) = 0;
    *(undefined8 *)((long)sa + 0x10) = 0;
    *(undefined8 *)((long)sa + 0x18) = 0;
    *(undefined8 *)sa = 0;
    *(undefined8 *)((long)sa + 8) = 0;
    sVar2 = nni_strlcpy((char *)((long)sa + 2),(na->s_ipc).sa_path,0x6c);
    if (sVar2 < 0x6c) {
      *(undefined2 *)sa = 1;
      return 0x6e;
    }
    break;
  case 3:
    *(undefined8 *)sa = 0;
    *(undefined8 *)((long)sa + 8) = 0;
    *(undefined2 *)sa = 2;
    *(uint16_t *)((long)sa + 2) = (na->s_in6).sa_port;
    *(uint32_t *)((long)sa + 4) = (na->s_in).sa_addr;
    return 0x10;
  case 4:
    *(undefined8 *)sa = 0;
    *(undefined8 *)((long)sa + 8) = 0;
    *(undefined8 *)((long)sa + 0xc) = 0;
    *(undefined8 *)((long)sa + 0x14) = 0;
    *(undefined2 *)sa = 10;
    *(uint16_t *)((long)sa + 2) = (na->s_in6).sa_port;
    *(uint32_t *)((long)sa + 0x18) = (na->s_in6).sa_scope;
    uVar1 = *(undefined8 *)((long)(na->s_storage).sa_pad + 4);
    *(undefined8 *)((long)sa + 8) = *(undefined8 *)((na->s_ipc).sa_path + 2);
    *(undefined8 *)((long)sa + 0x10) = uVar1;
    return 0x1c;
  case 5:
    if ((na->s_in6).sa_port < 0x6c) {
      *(undefined8 *)((long)sa + 0x5e) = 0;
      *(undefined8 *)((long)sa + 0x66) = 0;
      *(undefined8 *)((long)sa + 0x52) = 0;
      *(undefined8 *)((long)sa + 0x5a) = 0;
      *(undefined8 *)((long)sa + 0x42) = 0;
      *(undefined8 *)((long)sa + 0x4a) = 0;
      *(undefined8 *)((long)sa + 0x32) = 0;
      *(undefined8 *)((long)sa + 0x3a) = 0;
      *(undefined8 *)((long)sa + 0x22) = 0;
      *(undefined8 *)((long)sa + 0x2a) = 0;
      *(undefined8 *)((long)sa + 0x12) = 0;
      *(undefined8 *)((long)sa + 0x1a) = 0;
      *(undefined8 *)((long)sa + 2) = 0;
      *(undefined8 *)((long)sa + 10) = 0;
      *(undefined2 *)sa = 1;
      if ((ulong)(na->s_in6).sa_port != 0) {
        memcpy((void *)((long)sa + 3),(na->s_ipc).sa_path + 2,(ulong)(na->s_in6).sa_port);
        return (ulong)(na->s_in6).sa_port + 3;
      }
      return 2;
    }
  }
  return 0;
}

Assistant:

size_t
nni_posix_nn2sockaddr(void *sa, const nni_sockaddr *na)
{
	struct sockaddr_in          *sin;
	struct sockaddr_un          *spath;
	const nng_sockaddr_in       *nsin;
	const nng_sockaddr_path     *nspath;
	const nng_sockaddr_abstract *nsabs;
	size_t                       sz;
#ifdef NNG_ENABLE_IPV6
	struct sockaddr_in6    *sin6;
	const nng_sockaddr_in6 *nsin6;
#endif

	if ((sa == NULL) || (na == NULL)) {
		return (0);
	}
	switch (na->s_family) {
	case NNG_AF_INET:
		sin  = (void *) sa;
		nsin = &na->s_in;
		memset(sin, 0, sizeof(*sin));
		sin->sin_family      = PF_INET;
		sin->sin_port        = nsin->sa_port;
		sin->sin_addr.s_addr = nsin->sa_addr;
		return (sizeof(*sin));

#ifdef NNG_ENABLE_IPV6
	case NNG_AF_INET6:
		sin6  = (void *) sa;
		nsin6 = &na->s_in6;
		memset(sin6, 0, sizeof(*sin6));
#ifdef SIN6_LEN
		sin6->sin6_len = sizeof(*sin6);
#endif
		sin6->sin6_family   = PF_INET6;
		sin6->sin6_port     = nsin6->sa_port;
		sin6->sin6_scope_id = nsin6->sa_scope;
		memcpy(sin6->sin6_addr.s6_addr, nsin6->sa_addr, 16);
		return (sizeof(*sin6));
#endif

	case NNG_AF_IPC:
		spath  = (void *) sa;
		nspath = &na->s_ipc;
		memset(spath, 0, sizeof(*spath));
		// Make sure that the path fits!
		sz = sizeof(spath->sun_path);
		if (nni_strlcpy(spath->sun_path, nspath->sa_path, sz) >= sz) {
			return (0);
		}
		spath->sun_family = PF_UNIX;
		return (sizeof(*spath));

	case NNG_AF_ABSTRACT:
		spath = (void *) sa;
		nsabs = &na->s_abstract;
		if (nsabs->sa_len >= sizeof(spath->sun_path)) {
			return (0);
		}
		memset(spath, 0, sizeof(*spath));
		spath->sun_family  = PF_UNIX;
		spath->sun_path[0] = '\0'; // abstract starts with nul

		// We support auto-bind with an empty string.  There is
		// a subtle caveat here, which is that we cannot bind to
		// the *empty* name.
		if (nsabs->sa_len == 0) {
			return (sizeof(sa_family_t)); // auto bind
		} else {
			memcpy(&spath->sun_path[1], nsabs->sa_name,
			    nsabs->sa_len);
			return (sizeof(sa_family_t) + 1 + nsabs->sa_len);
		}
	}
	return (0);
}